

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-metrics.c
# Opt level: O0

void create_cb(uv_fs_t *req)

{
  int iVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  int64_t eval_b_3;
  int64_t eval_a_3;
  uv_buf_t iov;
  int64_t eval_b_2;
  int64_t eval_a_2;
  uint64_t eval_b_1;
  uint64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  uv_metrics_t metrics;
  uv_fs_t *req_local;
  
  metrics.reserved[0xc] = (uint64_t *)req;
  uVar2 = uv_default_loop();
  iVar1 = uv_metrics_info(uVar2,&eval_a);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-metrics.c"
            ,0xbd,"uv_metrics_info(uv_default_loop(), &metrics)","==","0",(long)iVar1,"==",0);
    abort();
  }
  if (eval_a != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%lu %s %lu)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-metrics.c"
            ,0xbf,"1","==","metrics.loop_count",1,"==",eval_a);
    abort();
  }
  iov.len = 0;
  if ((long)metrics.reserved[0xc][0xb] < 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-metrics.c"
            ,0xc0,"req->result",">=","0",metrics.reserved[0xc][0xb],">=",0);
    abort();
  }
  uv_fs_req_cleanup(metrics.reserved[0xc]);
  last_events_count = metrics.loop_count;
  auVar3 = uv_buf_init(test_buf,0xd);
  iov.base = auVar3._8_8_;
  eval_a_3 = auVar3._0_8_;
  uVar2 = uv_default_loop();
  iVar1 = uv_fs_write(uVar2,0x34cd60,metrics.reserved[0xc][0xb] & 0xffffffff,&eval_a_3,1,0,write_cb)
  ;
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-metrics.c"
            ,0xcc,
            "uv_fs_write(uv_default_loop(), &fs_reqs.write_req, (uv_os_fd_t) req->result, &iov, 1, 0, write_cb)"
            ,"==","0",(long)iVar1,"==",0);
    abort();
  }
  return;
}

Assistant:

static void create_cb(uv_fs_t* req) {
  uv_metrics_t metrics;

  ASSERT_OK(uv_metrics_info(uv_default_loop(), &metrics));
  /* Event count here is still 0 so not going to check. */
  ASSERT_UINT64_EQ(1, metrics.loop_count);
  ASSERT_GE(req->result, 0);

  uv_fs_req_cleanup(req);
  last_events_count = metrics.events;

  uv_buf_t iov = uv_buf_init(test_buf, sizeof(test_buf));
  ASSERT_OK(uv_fs_write(uv_default_loop(),
                        &fs_reqs.write_req,
                        (uv_os_fd_t) req->result,
                        &iov,
                        1,
                        0,
                        write_cb));
}